

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::rescale(raw_quasi_adaptive_huffman_data_model *this)

{
  int iVar1;
  unsigned_short *puVar2;
  vector<unsigned_short> *in_RDI;
  uint freq;
  uint i;
  uint total_freq;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < in_RDI[3].m_size; local_10 = local_10 + 1) {
    puVar2 = vector<unsigned_short>::operator[](in_RDI,local_10);
    iVar1 = (int)(*puVar2 + 1) >> 1;
    local_c = iVar1 + local_c;
    puVar2 = vector<unsigned_short>::operator[](in_RDI,local_10);
    *puVar2 = (unsigned_short)iVar1;
  }
  in_RDI[4].m_size = local_c;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::rescale()
   {
      uint total_freq = 0;

      for (uint i = 0; i < m_total_syms; i++)
      {
         uint freq = (m_sym_freq[i] + 1) >> 1;
         total_freq += freq;
         m_sym_freq[i] = static_cast<uint16>(freq);
      }

      m_total_count = total_freq;
   }